

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

TensorValue_RepeatedBytes * __thiscall
google::protobuf::Arena::DoCreateMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>
          (Arena *this)

{
  TensorValue_RepeatedBytes *this_00;
  
  this_00 = (TensorValue_RepeatedBytes *)
            AllocateAlignedWithHook
                      (this,0x20,
                       (type_info *)
                       &CoreML::Specification::MILSpec::TensorValue_RepeatedBytes::typeinfo);
  CoreML::Specification::MILSpec::TensorValue_RepeatedBytes::TensorValue_RepeatedBytes
            (this_00,this,false);
  return this_00;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }